

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
::_find_key<int>(raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                 *this,int *key,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  __m128i match;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  char cVar16;
  char cVar18;
  char cVar19;
  char cVar20;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar9 = hashval >> 7 & uVar2;
  bVar6 = (byte)hashval;
  uVar5 = (ulong)(bVar6 & 0x7f);
  auVar14 = ZEXT216(CONCAT11(bVar6,bVar6) & 0x7f7f);
  auVar14 = pshuflw(auVar14,auVar14,0);
  lVar8 = 0;
  do {
    pcVar1 = this->ctrl_ + uVar9;
    cVar16 = auVar14[0];
    auVar17[0] = -(cVar16 == *pcVar1);
    cVar18 = auVar14[1];
    auVar17[1] = -(cVar18 == pcVar1[1]);
    cVar19 = auVar14[2];
    auVar17[2] = -(cVar19 == pcVar1[2]);
    cVar20 = auVar14[3];
    auVar17[3] = -(cVar20 == pcVar1[3]);
    auVar17[4] = -(cVar16 == pcVar1[4]);
    auVar17[5] = -(cVar18 == pcVar1[5]);
    auVar17[6] = -(cVar19 == pcVar1[6]);
    auVar17[7] = -(cVar20 == pcVar1[7]);
    auVar17[8] = -(cVar16 == pcVar1[8]);
    auVar17[9] = -(cVar18 == pcVar1[9]);
    auVar17[10] = -(cVar19 == pcVar1[10]);
    auVar17[0xb] = -(cVar20 == pcVar1[0xb]);
    auVar17[0xc] = -(cVar16 == pcVar1[0xc]);
    auVar17[0xd] = -(cVar18 == pcVar1[0xd]);
    auVar17[0xe] = -(cVar19 == pcVar1[0xe]);
    auVar17[0xf] = -(cVar20 == pcVar1[0xf]);
    uVar4 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf;
    iVar11 = 4;
    bVar13 = uVar4 == 0;
    if (!bVar13) {
      uVar7 = (uint)uVar4;
      do {
        uVar3 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        uVar12 = uVar3 + uVar9 & uVar2;
        if (this->slots_[uVar12] == *key) {
          iVar11 = 1;
          uVar5 = uVar12;
          break;
        }
        uVar7 = uVar7 - 1 & uVar7;
        bVar13 = uVar7 == 0;
      } while (!bVar13);
    }
    if (bVar13) {
      auVar15[0] = -(*pcVar1 == -0x80);
      auVar15[1] = -(pcVar1[1] == -0x80);
      auVar15[2] = -(pcVar1[2] == -0x80);
      auVar15[3] = -(pcVar1[3] == -0x80);
      auVar15[4] = -(pcVar1[4] == -0x80);
      auVar15[5] = -(pcVar1[5] == -0x80);
      auVar15[6] = -(pcVar1[6] == -0x80);
      auVar15[7] = -(pcVar1[7] == -0x80);
      auVar15[8] = -(pcVar1[8] == -0x80);
      auVar15[9] = -(pcVar1[9] == -0x80);
      auVar15[10] = -(pcVar1[10] == -0x80);
      auVar15[0xb] = -(pcVar1[0xb] == -0x80);
      auVar15[0xc] = -(pcVar1[0xc] == -0x80);
      auVar15[0xd] = -(pcVar1[0xd] == -0x80);
      auVar15[0xe] = -(pcVar1[0xe] == -0x80);
      auVar15[0xf] = -(pcVar1[0xf] == -0x80);
      iVar11 = 3;
      if ((((((((((((((((auVar15 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar15 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar15 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar15 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar15 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar15 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar15 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar15 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar15 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar15 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar15 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar15 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar15 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar15 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar15 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar15[0xf])
      {
        lVar10 = uVar9 + lVar8;
        lVar8 = lVar8 + 0x10;
        uVar9 = lVar10 + 0x10U & uVar2;
        iVar11 = 0;
      }
    }
    if (iVar11 != 0) {
      if (iVar11 == 3) {
        uVar5 = 0xffffffffffffffff;
      }
      return uVar5;
    }
  } while( true );
}

Assistant:

probe_seq<Group::kWidth> probe(size_t hashval) const {
        return probe_seq<Group::kWidth>(H1(hashval, ctrl_), capacity_);
    }